

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O2

void __thiscall TcpServer::daemonRun(TcpServer *this)

{
  map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
  *this_00;
  uint32_t *puVar1;
  int iVar2;
  epoll_event *peVar3;
  bool bVar4;
  uint uVar5;
  WriteContentResult WVar6;
  iterator iVar7;
  char *__args_1;
  unsigned_long __args_2;
  mapped_type *pmVar8;
  iterator iVar9;
  int *piVar10;
  ulong uVar11;
  iterator iVar12;
  size_type sVar13;
  string local_d0;
  ulong local_b0;
  function<void_(const_TcpConnection_*,_const_char_*,_unsigned_long,_void_*)> *local_a8;
  ulong local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  function<void_(const_TcpConnection_*,_void_*)> *local_88;
  set<int,_std::less<int>,_std::allocator<int>_> *local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  epoll_event *local_68;
  function<void_(const_TcpConnection_*,_void_*)> *local_60;
  string *local_58;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *local_50;
  int local_44;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *p_Stack_40;
  int fd;
  allocator<char> local_31;
  
  local_68 = (epoll_event *)operator_new__(0x3000);
  p_Stack_40 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                *)&this->toWriteContents;
  this_00 = &this->connections;
  local_90 = &(this->connections)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8 = &this->onReadHandler;
  local_88 = &this->onPeerShutdownHandler;
  local_50 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              *)&this->inActiveWriteContents;
  local_58 = &this->errorString;
  local_70 = &(this->inActiveWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60 = &this->onCanWriteHandler;
  local_98 = &(this->toWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = &this->closeWhenWriteFinish;
  local_78 = &(this->closeWhenWriteFinish)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    while( true ) {
      uVar5 = epoll_wait(this->epollFd,local_68,0x400,
                         -(uint)((this->toWriteContents)._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count == 0));
      if (-1 < (int)uVar5) break;
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x230);
      Logger::printLog(&logger,LOG_ERROR,local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x231);
    }
    local_a0 = (ulong)uVar5;
    uVar11 = 0;
    while (peVar3 = local_68, uVar11 != local_a0) {
      puVar1 = &local_68->events + uVar11 * 3;
      local_b0 = uVar11;
      printEvent(this,*(int *)(&local_68->field_0x4 + uVar11 * 0xc),(&local_68->events)[uVar11 * 3])
      ;
      iVar2 = *(int *)(&peVar3->field_0x4 + uVar11 * 0xc);
      if (iVar2 == this->serverFd) {
        if ((*puVar1 & 1) != 0) {
          bVar4 = acceptNewConnection(this);
          if (!bVar4) {
            recordError(this,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                        ,0x239);
            Logger::printLog(&logger,LOG_ERROR,local_58,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                             ,0x23a);
          }
        }
      }
      else if (iVar2 == this->pipeFds[0]) {
        if ((*puVar1 & 1) != 0) {
          handleNotify(this);
        }
      }
      else {
        local_44 = iVar2;
        iVar7 = std::
                _Rb_tree<int,_std::pair<const_int,_TcpConnection>,_std::_Select1st<std::pair<const_int,_TcpConnection>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                ::find(&this_00->_M_t,&local_44);
        if (iVar7._M_node == local_90) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"fd not seen before",&local_31);
          Logger::printLog(&logger,LOG_ERROR,&local_d0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                           ,0x246);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else if ((*puVar1 & 0x11) == 0) {
          if ((*puVar1 & 4) != 0) {
            iVar9 = std::
                    _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                    ::find((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                            *)local_50,&local_44);
            if (iVar9._M_node != local_70) {
              std::
              _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              ::
              _M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                        (p_Stack_40,
                         (pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
                         (iVar9._M_node + 1));
              std::
              _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              ::erase_abi_cxx11_(local_50,iVar9);
              pmVar8 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](this_00,&local_44);
              std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                        (local_60,pmVar8,this->data);
            }
          }
        }
        else {
          __args_1 = (char *)operator_new__(0x14000);
          while( true ) {
            __args_2 = read(local_44,__args_1,0x14000);
            if ((long)__args_2 < 1) break;
            if ((this->onReadHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
              std::
              map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
              ::operator[](this_00,&local_44);
              pmVar8 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](this_00,&local_44);
              std::function<void_(const_TcpConnection_*,_const_char_*,_unsigned_long,_void_*)>::
              operator()(local_a8,pmVar8,__args_1,__args_2,this->data);
            }
          }
          if ((long)__args_2 < 0) {
            piVar10 = __errno_location();
            if (*piVar10 != 0xb) {
              recordError(this,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,600);
              Logger::printLog(&logger,LOG_ERROR,local_58,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                               ,0x259);
            }
          }
          else {
            if ((this->onPeerShutdownHandler).super__Function_base._M_manager != (_Manager_type)0x0)
            {
              pmVar8 = std::
                       map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                       ::operator[](this_00,&local_44);
              std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                        (local_88,pmVar8,this->data);
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::erase((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                     *)p_Stack_40,&local_44);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::erase((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                     *)local_50,&local_44);
          }
          operator_delete__(__args_1);
        }
      }
      uVar11 = local_b0 + 1;
    }
    iVar9._M_node = (this->toWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (iVar9._M_node != local_98) {
      WVar6 = writeContent(this,iVar9._M_node[1]._M_color);
      if (WVar6 == Move_to_Inactive) {
        std::
        _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
        ::_M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                  (local_50,(pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
                            (iVar9._M_node + 1));
LAB_001054a3:
        iVar9 = std::
                _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
                ::erase_abi_cxx11_(p_Stack_40,iVar9);
      }
      else if (WVar6 == OK) {
        iVar12 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::find(&local_80->_M_t,iVar9._M_node + 1);
        if ((iVar12._M_node == local_78) &&
           ((this->onCanWriteHandler).super__Function_base._M_manager != (_Manager_type)0x0)) {
          pmVar8 = std::
                   map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                   ::operator[](this_00,(key_type *)(iVar9._M_node + 1));
          std::function<void_(const_TcpConnection_*,_void_*)>::operator()
                    (local_60,pmVar8,this->data);
        }
        sVar13 = std::deque<WriteMeta,_std::allocator<WriteMeta>_>::size
                           ((deque<WriteMeta,_std::allocator<WriteMeta>_> *)
                            &iVar9._M_node[1]._M_parent);
        if (sVar13 == 0) goto LAB_001054a3;
        iVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
      }
      else if (WVar6 == DeleteConnection) {
        closeConnection(this,iVar9._M_node[1]._M_color);
        goto LAB_001054a3;
      }
    }
  } while( true );
}

Assistant:

void daemonRun() {
    struct epoll_event *toHandleEvents;
    toHandleEvents = new struct epoll_event[1024];
    assert(toHandleEvents);
    for (;;) {
      int epollRet = -1;
      if (toWriteContents.empty()) {
        // 没有需要写的，阻塞等待
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024, -1);
      } else {
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024,
                              0);  // 立刻返回，用于write
      }
      if (epollRet < 0) {
        recordError(__FILE__, __LINE__);
        Log(logger, Logger::LOG_ERROR, errorString);
      } else {
        for (int i = 0; i < epollRet; ++i) {
          printEvent(toHandleEvents[i].data.fd, toHandleEvents[i].events);
          // 监听的serverFd
          if (toHandleEvents[i].data.fd == serverFd) {
            if (toHandleEvents[i].events & EPOLLIN) {
              if (!acceptNewConnection()) {
                recordError(__FILE__, __LINE__);
                Log(logger, Logger::LOG_ERROR, errorString);
              }
            }
          } else if (toHandleEvents[i].data.fd == pipeFds[0]) {
            // 调用者通知管道fd
            if (toHandleEvents[i].events & EPOLLIN) {
              handleNotify();
            }
          } else {
            // 处理客户端的连接
            int fd = toHandleEvents[i].data.fd;
            if (connections.find(fd) == connections.end()) {
              Log(logger, Logger::LOG_ERROR, "fd not seen before");
              continue;
            }
            if (toHandleEvents[i].events & EPOLLIN ||
                toHandleEvents[i].events & EPOLLHUP) {
              char *buffer = nullptr;
              buffer = new char[BUFFER_SIZE];
              assert(buffer);
              ssize_t number = -1;
              while ((number = read(fd, buffer, BUFFER_SIZE)) > 0) {
                if (onReadHandler) {
                  auto c = connections[fd];
                  onReadHandler(&(connections[fd]), buffer, number, data);
                }
              }
              if (number < 0) {
                if (errno == EAGAIN) {
                } else {
                  recordError(__FILE__, __LINE__);
                  Log(logger, Logger::LOG_ERROR, errorString);
                }
              } else if (number == 0) {
                // 对端关闭了连接，通知调用者
                // closeConnection(fd);
                if (onPeerShutdownHandler) {
                  onPeerShutdownHandler(&(connections[fd]), data);
                }
                // 删除write队列中的数据
                toWriteContents.erase(fd);
                inActiveWriteContents.erase(fd);
              }
              delete[] buffer;
            } else if (toHandleEvents[i].events & EPOLLOUT) {
              auto index = inActiveWriteContents.find(fd);
              if (index != inActiveWriteContents.end()) {
                toWriteContents.insert(*index);
                inActiveWriteContents.erase(index);
                onCanWriteHandler(&connections[fd], data);
              }
            }
          }
        }
        // 处理write
        for (auto index = toWriteContents.begin();
             index != toWriteContents.end();) {
          WriteContentResult result = writeContent(index->first);
          if (result == WriteContentResult::DeleteConnection) {
            // 关闭连接
            closeConnection(index->first);
            // 删除要写的数据
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::Move_to_Inactive) {
            inActiveWriteContents.insert(*index);
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::OK) {
            if (closeWhenWriteFinish.find(index->first) ==
                closeWhenWriteFinish.cend()) {
              if (onCanWriteHandler) {
                onCanWriteHandler(&(connections[index->first]), data);
              }
            }
            if (index->second.size() == 0) {
              index = toWriteContents.erase(index);
            } else {
              ++index;
            }
          }
        }
      }
    }
  }